

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

int64_t celero::GetRAMVirtualUsed(void)

{
  int64_t total;
  sysinfo memInfo;
  
  sysinfo((sysinfo *)&total);
  return (memInfo.bufferram - memInfo.totalswap) * (ulong)(uint)memInfo.freehigh;
}

Assistant:

int64_t celero::GetRAMVirtualUsed()
{
#ifdef _WIN32
	return celero::GetRAMVirtualTotal() - celero::GetRAMVirtualAvailable();
#elif defined(__APPLE__)
	return -1;
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	const int64_t total = memInfo.totalswap - memInfo.freeswap;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}